

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O0

bool illegalIpxStoppedCrossoverStatus(Info *ipx_info,HighsOptions *options)

{
  HighsOptions *in_RSI;
  long in_RDI;
  bool found_illegal_status;
  undefined8 in_stack_fffffffffffffde8;
  int value;
  undefined5 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf5;
  byte bVar1;
  undefined1 in_stack_fffffffffffffdf6;
  undefined1 in_stack_fffffffffffffdf7;
  HighsOptions *in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  allocator *paVar2;
  undefined1 status_error;
  bool local_1f3;
  bool local_1db;
  bool local_1c3;
  bool local_1ab;
  bool local_193;
  bool local_17b;
  allocator local_161;
  string local_160 [37];
  byte local_13b;
  byte local_13a;
  allocator local_139;
  string local_138 [37];
  byte local_113;
  byte local_112;
  allocator local_111;
  string local_110 [37];
  byte local_eb;
  byte local_ea;
  allocator local_e9;
  string local_e8 [37];
  byte local_c3;
  byte local_c2;
  allocator local_c1;
  string local_c0 [37];
  byte local_9b;
  byte local_9a;
  allocator local_99;
  string local_98 [37];
  byte local_73;
  byte local_72;
  allocator local_71;
  string local_70 [35];
  byte local_4d;
  byte local_3a;
  allocator local_39;
  string local_38 [39];
  bool local_11;
  HighsOptions *local_10;
  long local_8;
  
  status_error = (undefined1)((ulong)in_stack_fffffffffffffe00 >> 0x38);
  local_11 = false;
  local_3a = 0;
  local_4d = 0;
  value = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  local_3a = 1;
  std::__cxx11::string::string
            (local_38,"stopped status_crossover should not be IPX_STATUS_optimal",&local_39);
  local_4d = 1;
  local_11 = ipxStatusError((bool)status_error,in_stack_fffffffffffffdf8,
                            (string *)
                            CONCAT17(in_stack_fffffffffffffdf7,
                                     CONCAT16(in_stack_fffffffffffffdf6,
                                              CONCAT15(in_stack_fffffffffffffdf5,
                                                       in_stack_fffffffffffffdf0))),value);
  if ((local_4d & 1) != 0) {
    std::__cxx11::string::~string(local_38);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  local_72 = 0;
  local_73 = 0;
  local_17b = true;
  if ((local_11 & 1U) == 0) {
    std::allocator<char>::allocator();
    local_72 = 1;
    std::__cxx11::string::string
              (local_70,"stopped status_crossover should not be IPX_STATUS_imprecise",&local_71);
    local_73 = 1;
    local_17b = ipxStatusError((bool)status_error,in_stack_fffffffffffffdf8,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffdf7,
                                        CONCAT16(in_stack_fffffffffffffdf6,
                                                 CONCAT15(in_stack_fffffffffffffdf5,
                                                          in_stack_fffffffffffffdf0))),value);
  }
  local_11 = local_17b;
  if ((local_73 & 1) != 0) {
    std::__cxx11::string::~string(local_70);
  }
  if ((local_72 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  local_9a = 0;
  local_9b = 0;
  local_193 = true;
  if ((local_11 & 1U) == 0) {
    std::allocator<char>::allocator();
    local_9a = 1;
    std::__cxx11::string::string
              (local_98,"stopped status_crossover should not be IPX_STATUS_primal_infeas",&local_99)
    ;
    local_9b = 1;
    local_193 = ipxStatusError((bool)status_error,in_stack_fffffffffffffdf8,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffdf7,
                                        CONCAT16(in_stack_fffffffffffffdf6,
                                                 CONCAT15(in_stack_fffffffffffffdf5,
                                                          in_stack_fffffffffffffdf0))),value);
  }
  local_11 = local_193;
  if ((local_9b & 1) != 0) {
    std::__cxx11::string::~string(local_98);
  }
  if ((local_9a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  local_c2 = 0;
  local_c3 = 0;
  local_1ab = true;
  if ((local_11 & 1U) == 0) {
    std::allocator<char>::allocator();
    local_c2 = 1;
    std::__cxx11::string::string
              (local_c0,"stopped status_crossover should not be IPX_STATUS_dual_infeas",&local_c1);
    local_c3 = 1;
    local_1ab = ipxStatusError((bool)status_error,in_stack_fffffffffffffdf8,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffdf7,
                                        CONCAT16(in_stack_fffffffffffffdf6,
                                                 CONCAT15(in_stack_fffffffffffffdf5,
                                                          in_stack_fffffffffffffdf0))),value);
  }
  local_11 = local_1ab;
  if ((local_c3 & 1) != 0) {
    std::__cxx11::string::~string(local_c0);
  }
  if ((local_c2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  local_ea = 0;
  local_eb = 0;
  local_1c3 = true;
  if ((local_11 & 1U) == 0) {
    std::allocator<char>::allocator();
    local_ea = 1;
    std::__cxx11::string::string
              (local_e8,"stopped status_crossover should not be IPX_STATUS_iter_limit",&local_e9);
    local_eb = 1;
    local_1c3 = ipxStatusError((bool)status_error,in_stack_fffffffffffffdf8,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffdf7,
                                        CONCAT16(in_stack_fffffffffffffdf6,
                                                 CONCAT15(in_stack_fffffffffffffdf5,
                                                          in_stack_fffffffffffffdf0))),value);
  }
  local_11 = local_1c3;
  if ((local_eb & 1) != 0) {
    std::__cxx11::string::~string(local_e8);
  }
  if ((local_ea & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  local_112 = 0;
  local_113 = 0;
  local_1db = true;
  if ((local_11 & 1U) == 0) {
    std::allocator<char>::allocator();
    local_112 = 1;
    std::__cxx11::string::string
              (local_110,"stopped status_crossover should not be IPX_STATUS_no_progress",&local_111)
    ;
    local_113 = 1;
    local_1db = ipxStatusError((bool)status_error,in_stack_fffffffffffffdf8,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffdf7,
                                        CONCAT16(in_stack_fffffffffffffdf6,
                                                 CONCAT15(in_stack_fffffffffffffdf5,
                                                          in_stack_fffffffffffffdf0))),value);
  }
  local_11 = local_1db;
  if ((local_113 & 1) != 0) {
    std::__cxx11::string::~string(local_110);
  }
  if ((local_112 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
  }
  local_13a = 0;
  local_13b = 0;
  local_1f3 = true;
  if ((local_11 & 1U) == 0) {
    in_stack_fffffffffffffdf7 = *(int *)(local_8 + 8) == 9;
    paVar2 = &local_139;
    std::allocator<char>::allocator();
    local_13a = 1;
    std::__cxx11::string::string
              (local_138,"stopped status_crossover should not be IPX_STATUS_failed",paVar2);
    local_13b = 1;
    status_error = (undefined1)((ulong)paVar2 >> 0x38);
    in_stack_fffffffffffffdf6 =
         ipxStatusError((bool)status_error,local_10,
                        (string *)
                        CONCAT17(in_stack_fffffffffffffdf7,
                                 CONCAT16(in_stack_fffffffffffffdf6,
                                          CONCAT15(in_stack_fffffffffffffdf5,
                                                   in_stack_fffffffffffffdf0))),value);
    in_stack_fffffffffffffdf8 = local_10;
    local_1f3 = (bool)in_stack_fffffffffffffdf6;
  }
  local_11 = local_1f3;
  if ((local_13b & 1) != 0) {
    std::__cxx11::string::~string(local_138);
  }
  if ((local_13a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  bVar1 = 1;
  if ((local_11 & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_160,"stopped status_crossover should not be IPX_STATUS_debug",&local_161);
    local_11 = ipxStatusError((bool)status_error,in_stack_fffffffffffffdf8,
                              (string *)
                              CONCAT17(in_stack_fffffffffffffdf7,
                                       CONCAT16(in_stack_fffffffffffffdf6,
                                                CONCAT15(bVar1,in_stack_fffffffffffffdf0))),
                              (int)((ulong)&local_161 >> 0x20));
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    bVar1 = local_11;
  }
  local_11 = (bool)bVar1;
  return (bool)(local_11 & 1);
}

Assistant:

bool illegalIpxStoppedCrossoverStatus(const ipx::Info& ipx_info,
                                      const HighsOptions& options) {
  bool found_illegal_status = false;
  // Cannot stop and be optimal
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_optimal, options,
          "stopped status_crossover should not be IPX_STATUS_optimal");
  // Cannot stop and be imprecise
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_imprecise, options,
          "stopped status_crossover should not be IPX_STATUS_imprecise");
  // Cannot stop with primal infeasibility
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_primal_infeas, options,
          "stopped status_crossover should not be IPX_STATUS_primal_infeas");
  // Cannot stop with dual infeasibility
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_dual_infeas, options,
          "stopped status_crossover should not be IPX_STATUS_dual_infeas");
  // Cannot stop and reach iteration limit
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_iter_limit, options,
          "stopped status_crossover should not be IPX_STATUS_iter_limit");
  // Can stop and reach time limit
  // Cannot stop with no_progress
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_no_progress, options,
          "stopped status_crossover should not be IPX_STATUS_no_progress");
  // Cannot stop and failed - should be error return earlier
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_failed, options,
          "stopped status_crossover should not be IPX_STATUS_failed");
  // Cannot stop and debug - should be error return earlier
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_crossover == IPX_STATUS_debug, options,
                     "stopped status_crossover should not be IPX_STATUS_debug");
  return found_illegal_status;
}